

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O1

void __thiscall
HACD::MyMicroAllocator::MyMicroAllocator
          (MyMicroAllocator *this,MicroHeap *heap,void *baseMem,NxU32 initialSize,NxU32 chunkSize)

{
  MemoryHeader *pMVar1;
  undefined8 *puVar2;
  NxU32 *pNVar3;
  long lVar4;
  ulong uVar5;
  NxU8 *pNVar6;
  uint uVar7;
  long lVar8;
  MemoryHeader *next;
  MemoryHeader *pMVar9;
  undefined1 auVar10 [16];
  
  (this->super_MicroAllocator)._vptr_MicroAllocator = (_func_int **)&PTR___cxa_pure_virtual_00b6a4a8
  ;
  (this->super_MicroChunkUpdate)._vptr_MicroChunkUpdate =
       (_func_int **)&PTR___cxa_pure_virtual_00b6a4d8;
  MemMutex::MemMutex(&this->super_MemMutex);
  (this->super_MicroAllocator)._vptr_MicroAllocator = (_func_int **)&PTR_malloc_00b6a3d0;
  (this->super_MicroChunkUpdate)._vptr_MicroChunkUpdate = (_func_int **)&PTR_addMicroChunk_00b6a410;
  pNVar3 = &this->mAlloc[0].mChunks.mChunks[0].mChunkSize;
  lVar4 = 0x888;
  do {
    lVar8 = 0;
    do {
      *(undefined8 *)((long)pNVar3 + lVar8 + -8) = 0;
      *(undefined1 *)((long)pNVar3 + lVar8 + -0x28) = 0;
      *(undefined4 *)((long)pNVar3 + lVar8) = 0;
      puVar2 = (undefined8 *)((long)pNVar3 + lVar8 + -0x20);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined4 *)((long)pNVar3 + lVar8 + -0x10) = 0;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0x600);
    *(undefined8 *)((long)this->mFixedAllocators + lVar4 + -0x30) = 0;
    *(undefined8 *)((long)this->mFixedAllocators + lVar4 + -0x28) = 0;
    *(undefined8 *)((long)this->mFixedAllocators + lVar4 + -0x40) = 0;
    lVar4 = lVar4 + 0x630;
    pNVar3 = pNVar3 + 0x18c;
  } while (lVar4 != 0x2da8);
  auVar10 = ZEXT416(0) << 0x40;
  this->mMaxMicroChunks = auVar10._0_4_;
  this->mMicroChunkCount = auVar10._4_4_;
  this->mLastMicroChunk = (MicroChunk *)auVar10._8_8_;
  this->mMicroChunks = (MicroChunk *)0x0;
  this->mHeap = heap;
  this->mChunkSize = chunkSize;
  lVar4 = 0;
  do {
    this->mFixedAllocators[lVar4] = this->mAlloc;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 9);
  lVar4 = 0;
  do {
    this->mFixedAllocators[lVar4 + 9] = this->mAlloc + 1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  lVar4 = 0;
  do {
    this->mFixedAllocators[lVar4 + 0x11] = this->mAlloc + 2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  lVar4 = 0;
  do {
    this->mFixedAllocators[lVar4 + 0x21] = this->mAlloc + 3;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x20);
  lVar4 = 0;
  do {
    this->mFixedAllocators[lVar4 + 0x41] = this->mAlloc + 4;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x40);
  lVar4 = 0;
  do {
    this->mFixedAllocators[lVar4 + 0x81] = this->mAlloc + 5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x80);
  this->mBaseMem = (NxU8 *)baseMem;
  this->mBaseMemEnd = (NxU8 *)((ulong)initialSize + (long)baseMem);
  pMVar9 = (MemoryHeader *)((long)baseMem + 0x2dc8U & 0xfffffffffffffff0);
  this->mChunkStart = (NxU8 *)pMVar9;
  this->mAlloc[0].mMemBegin = (NxU8 *)pMVar9;
  uVar5 = (ulong)chunkSize;
  pMVar1 = (MemoryHeader *)((long)&pMVar9->mNext + uVar5);
  this->mAlloc[0].mMemEnd = (NxU8 *)pMVar1;
  this->mAlloc[0].mChunks.mHeap = heap;
  this->mAlloc[0].mChunks.mChunkSize = 8;
  uVar7 = chunkSize >> 3;
  this->mAlloc[0].mChunks.mMaxChunks = uVar7;
  this->mAlloc[0].mCurrent = this->mAlloc[0].mChunks.mChunks;
  this->mAlloc[0].mChunks.mChunks[0].mChunkSize = 8;
  this->mAlloc[0].mChunks.mChunks[0].mData = (NxU8 *)pMVar9;
  this->mAlloc[0].mChunks.mChunks[0].mDataEnd =
       (NxU8 *)((long)&pMVar9->mNext + (ulong)(chunkSize & 0xfffffff8));
  this->mAlloc[0].mChunks.mChunks[0].mFreeList = pMVar9;
  while (uVar7 = uVar7 - 1, uVar7 != 0) {
    pMVar9->mNext = pMVar9 + 1;
    pMVar9 = pMVar9 + 1;
  }
  pMVar9->mNext = (MemoryHeader *)0x0;
  this->mAlloc[1].mMemBegin = (NxU8 *)pMVar1;
  pMVar9 = (MemoryHeader *)((long)&pMVar1->mNext + uVar5);
  this->mAlloc[1].mMemEnd = (NxU8 *)pMVar9;
  this->mAlloc[1].mChunks.mHeap = heap;
  this->mAlloc[1].mChunks.mChunkSize = 0x10;
  uVar7 = chunkSize >> 4;
  this->mAlloc[1].mChunks.mMaxChunks = uVar7;
  this->mAlloc[1].mCurrent = this->mAlloc[1].mChunks.mChunks;
  this->mAlloc[1].mChunks.mChunks[0].mChunkSize = 0x10;
  this->mAlloc[1].mChunks.mChunks[0].mData = (NxU8 *)pMVar1;
  this->mAlloc[1].mChunks.mChunks[0].mDataEnd =
       (NxU8 *)((long)&pMVar1->mNext + (ulong)(chunkSize & 0xfffffff0));
  this->mAlloc[1].mChunks.mChunks[0].mFreeList = pMVar1;
  while (uVar7 = uVar7 - 1, uVar7 != 0) {
    pMVar1->mNext = pMVar1 + 2;
    pMVar1 = pMVar1 + 2;
  }
  pMVar1->mNext = (MemoryHeader *)0x0;
  this->mAlloc[2].mMemBegin = (NxU8 *)pMVar9;
  pMVar1 = (MemoryHeader *)((long)&pMVar9->mNext + uVar5);
  this->mAlloc[2].mMemEnd = (NxU8 *)pMVar1;
  this->mAlloc[2].mChunks.mHeap = heap;
  this->mAlloc[2].mChunks.mChunkSize = 0x20;
  uVar7 = chunkSize >> 5;
  this->mAlloc[2].mChunks.mMaxChunks = uVar7;
  this->mAlloc[2].mCurrent = this->mAlloc[2].mChunks.mChunks;
  this->mAlloc[2].mChunks.mChunks[0].mChunkSize = 0x20;
  this->mAlloc[2].mChunks.mChunks[0].mData = (NxU8 *)pMVar9;
  this->mAlloc[2].mChunks.mChunks[0].mDataEnd =
       (NxU8 *)((long)&pMVar9->mNext + (ulong)(chunkSize & 0xffffffe0));
  this->mAlloc[2].mChunks.mChunks[0].mFreeList = pMVar9;
  while (uVar7 = uVar7 - 1, uVar7 != 0) {
    pMVar9->mNext = pMVar9 + 4;
    pMVar9 = pMVar9 + 4;
  }
  pMVar9->mNext = (MemoryHeader *)0x0;
  this->mAlloc[3].mMemBegin = (NxU8 *)pMVar1;
  pMVar9 = (MemoryHeader *)((long)&pMVar1->mNext + uVar5);
  this->mAlloc[3].mMemEnd = (NxU8 *)pMVar9;
  this->mAlloc[3].mChunks.mHeap = heap;
  this->mAlloc[3].mChunks.mChunkSize = 0x40;
  uVar7 = chunkSize >> 6;
  this->mAlloc[3].mChunks.mMaxChunks = uVar7;
  this->mAlloc[3].mCurrent = this->mAlloc[3].mChunks.mChunks;
  this->mAlloc[3].mChunks.mChunks[0].mChunkSize = 0x40;
  this->mAlloc[3].mChunks.mChunks[0].mData = (NxU8 *)pMVar1;
  this->mAlloc[3].mChunks.mChunks[0].mDataEnd =
       (NxU8 *)((long)&pMVar1->mNext + (ulong)(chunkSize & 0xffffffc0));
  this->mAlloc[3].mChunks.mChunks[0].mFreeList = pMVar1;
  while (uVar7 = uVar7 - 1, uVar7 != 0) {
    pMVar1->mNext = pMVar1 + 8;
    pMVar1 = pMVar1 + 8;
  }
  pMVar1->mNext = (MemoryHeader *)0x0;
  this->mAlloc[4].mMemBegin = (NxU8 *)pMVar9;
  pMVar1 = (MemoryHeader *)((long)&pMVar9->mNext + uVar5);
  this->mAlloc[4].mMemEnd = (NxU8 *)pMVar1;
  this->mAlloc[4].mChunks.mHeap = heap;
  this->mAlloc[4].mChunks.mChunkSize = 0x80;
  uVar7 = chunkSize >> 7;
  this->mAlloc[4].mChunks.mMaxChunks = uVar7;
  this->mAlloc[4].mCurrent = this->mAlloc[4].mChunks.mChunks;
  this->mAlloc[4].mChunks.mChunks[0].mChunkSize = 0x80;
  this->mAlloc[4].mChunks.mChunks[0].mData = (NxU8 *)pMVar9;
  this->mAlloc[4].mChunks.mChunks[0].mDataEnd =
       (NxU8 *)((long)&pMVar9->mNext + (ulong)(chunkSize & 0xffffff80));
  this->mAlloc[4].mChunks.mChunks[0].mFreeList = pMVar9;
  while (uVar7 = uVar7 - 1, uVar7 != 0) {
    pMVar9->mNext = pMVar9 + 0x10;
    pMVar9 = pMVar9 + 0x10;
  }
  pMVar9->mNext = (MemoryHeader *)0x0;
  this->mAlloc[5].mMemBegin = (NxU8 *)pMVar1;
  pNVar6 = (NxU8 *)((long)&pMVar1->mNext + uVar5);
  this->mAlloc[5].mMemEnd = pNVar6;
  this->mAlloc[5].mChunks.mHeap = heap;
  this->mAlloc[5].mChunks.mChunkSize = 0x100;
  uVar7 = chunkSize >> 8;
  this->mAlloc[5].mChunks.mMaxChunks = uVar7;
  this->mAlloc[5].mCurrent = this->mAlloc[5].mChunks.mChunks;
  this->mAlloc[5].mChunks.mChunks[0].mChunkSize = 0x100;
  this->mAlloc[5].mChunks.mChunks[0].mData = (NxU8 *)pMVar1;
  this->mAlloc[5].mChunks.mChunks[0].mDataEnd =
       (NxU8 *)((long)&pMVar1->mNext + (ulong)(chunkSize & 0xffffff00));
  this->mAlloc[5].mChunks.mChunks[0].mFreeList = pMVar1;
  while (uVar7 = uVar7 - 1, uVar7 != 0) {
    pMVar1->mNext = pMVar1 + 0x20;
    pMVar1 = pMVar1 + 0x20;
  }
  pMVar1->mNext = (MemoryHeader *)0x0;
  this->mChunkEnd = pNVar6;
  if ((NxU8 *)((ulong)initialSize + (long)baseMem) < pNVar6) {
    __assert_fail("chunkBase <= mBaseMemEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACD/hacdMicroAllocator.cpp"
                  ,0x1b2,
                  "HACD::MyMicroAllocator::MyMicroAllocator(MicroHeap *, void *, NxU32, NxU32)");
  }
  return;
}

Assistant:

MyMicroAllocator(MicroHeap *heap,void *baseMem,NxU32 initialSize,NxU32 chunkSize)
  {
    mLastMicroChunk     = 0;
    mMicroChunks        = 0;
    mMicroChunkCount    = 0;
    mMaxMicroChunks		= 0;
	mHeap               = heap;
	mChunkSize          = chunkSize;

    // 0 through 8 bytes
    for (NxU32 i=0; i<=8; i++)
    {
        mFixedAllocators[i] = &mAlloc[0];
    }

    // 9 through 16 bytes
    for (NxU32 i=9; i<=16; i++)
    {
        mFixedAllocators[i] = &mAlloc[1];
    }

    // 17 through 32 bytes
    for (NxU32 i=17; i<=32; i++)
    {
        mFixedAllocators[i] = &mAlloc[2];
    }

    // 33 through 64
    for (NxU32 i=33; i<=64; i++)
    {
        mFixedAllocators[i] = &mAlloc[3];
    }

    // 65 through 128
    for (NxU32 i=65; i<=128; i++)
    {
        mFixedAllocators[i] = &mAlloc[4];
    }

    // 129 through 255
    for (NxU32 i=129; i<257; i++)
    {
        mFixedAllocators[i] = &mAlloc[5];
    }

    mBaseMem = (NxU8 *)baseMem;
    mBaseMemEnd = mBaseMem+initialSize;

    NxU8 *chunkBase = (NxU8 *)baseMem+sizeof(MyMicroAllocator);


    chunkBase+=32;
	NxU64 ptr = (NxU64)chunkBase;
	ptr = ptr>>4;
	ptr = ptr<<4; // make sure it is 16 byte aligned.
	chunkBase = (NxU8 *)ptr;

    mChunkStart = chunkBase;
    chunkBase = mAlloc[0].init(chunkBase,8,chunkSize,heap);
    chunkBase = mAlloc[1].init(chunkBase,16,chunkSize,heap);
    chunkBase = mAlloc[2].init(chunkBase,32,chunkSize,heap);
    chunkBase = mAlloc[3].init(chunkBase,64,chunkSize,heap);
    chunkBase = mAlloc[4].init(chunkBase,128,chunkSize,heap);
    chunkBase = mAlloc[5].init(chunkBase,256,chunkSize,heap);
	mChunkEnd = chunkBase;

    assert(chunkBase <= mBaseMemEnd );

  }